

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O3

bool __thiscall HSet::add(HSet *this,HighsInt entry)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  if (entry < 0) {
    return false;
  }
  if (this->setup_ == false) {
    setup(this,1,entry,false,(FILE *)0x0,false,true);
  }
  this_00 = &this->pointer_;
  if (this->max_entry_ < entry) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,(ulong)(entry + 1));
    iVar3 = this->max_entry_;
    if (iVar3 + 1 < entry) {
      memset((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start + (long)iVar3 + 1,0xff,
             (ulong)((entry - iVar3) - 2) * 4 + 4);
    }
    this->max_entry_ = entry;
  }
  else if (-1 < (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(uint)entry]) {
    bVar4 = false;
    if (this->debug_ == false) {
      return false;
    }
    goto LAB_00381a48;
  }
  piVar1 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  iVar3 = this->count_;
  if (iVar3 == (int)(uVar2 >> 2)) {
    std::vector<int,_std::allocator<int>_>::resize
              (&this->entry_,(long)(uVar2 * 0x40000000 + 0x100000000) >> 0x20);
    iVar3 = this->count_;
    piVar1 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(uint)entry] = iVar3;
  iVar3 = this->count_;
  this->count_ = iVar3 + 1;
  piVar1[iVar3] = entry;
  bVar4 = true;
  if (this->debug_ != true) {
    return true;
  }
LAB_00381a48:
  debug(this);
  return bVar4;
}

Assistant:

bool HSet::add(const HighsInt entry) {
  if (entry < min_entry) return false;
  if (!setup_) setup(1, entry);
  if (entry > max_entry_) {
    // Entry exceeds what's allowable so far so can't be in the list
    pointer_.resize(entry + 1);
    for (HighsInt ix = max_entry_ + 1; ix < entry; ix++)
      pointer_[ix] = no_pointer;
    max_entry_ = entry;
  } else if (pointer_[entry] > no_pointer) {
    // Duplicate
    if (debug_) debug();
    return false;
  }
  // New entry
  HighsInt size = entry_.size();
  if (count_ == size) {
    size++;
    entry_.resize(size);
  }
  pointer_[entry] = count_;
  entry_[count_++] = entry;
  if (debug_) debug();
  return true;
}